

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_null_with_string(void)

{
  bool bVar1;
  type local_410;
  undefined1 local_3eb;
  undefined1 local_3ea [2];
  basic_variable<std::allocator<char>_> local_3e8;
  undefined1 local_3ab;
  undefined1 local_3aa [2];
  undefined1 local_3a8 [8];
  variable data_7;
  type local_370;
  undefined1 local_34e;
  undefined1 local_34d [2];
  undefined1 local_34b;
  undefined1 local_34a [2];
  undefined1 local_348 [8];
  variable data_6;
  type local_310;
  undefined1 local_2eb;
  undefined1 local_2ea [2];
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab;
  undefined1 local_2aa [2];
  undefined1 local_2a8 [8];
  variable data_5;
  type local_270;
  undefined1 local_24e;
  undefined1 local_24d [2];
  undefined1 local_24b;
  undefined1 local_24a [2];
  undefined1 local_248 [8];
  variable data_4;
  type local_210;
  undefined1 local_1eb;
  undefined1 local_1ea [2];
  basic_variable<std::allocator<char>_> local_1e8;
  undefined1 local_1ab;
  undefined1 local_1aa [2];
  undefined1 local_1a8 [8];
  variable data_3;
  type local_170;
  undefined1 local_14e;
  undefined1 local_14d [2];
  undefined1 local_14b;
  undefined1 local_14a [2];
  undefined1 local_148 [8];
  variable data_2;
  type local_110;
  undefined1 local_eb;
  undefined1 local_ea [2];
  basic_variable<std::allocator<char>_> local_e8;
  undefined1 local_ab;
  undefined1 local_aa [2];
  undefined1 local_a8 [8];
  variable data_1;
  type local_70;
  undefined1 local_4f;
  undefined1 local_4e [19];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9c,"void append_suite::append_null_with_string()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,"alpha");
  local_4e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9e,"void append_suite::append_null_with_string()",local_4e,&local_4f);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            (&local_70,(basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("data.value<string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9f,"void append_suite::append_null_with_string()",&local_70,"alpha");
  std::__cxx11::string::~string((string *)&local_70);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a8);
  local_aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_a8);
  local_ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xa3,"void append_suite::append_null_with_string()",local_aa,&local_ab);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_a8,&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  local_ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                          ((basic_variable<std::allocator<char>_> *)local_a8);
  local_eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xa5,"void append_suite::append_null_with_string()",local_ea,&local_eb);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            (&local_110,(basic_variable<std::allocator<char>_> *)local_a8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("data.value<string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xa6,"void append_suite::append_null_with_string()",&local_110,"alpha");
  std::__cxx11::string::~string((string *)&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  local_14a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_14b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xab,"void append_suite::append_null_with_string()",local_14a,&local_14b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_148,L"bravo");
  local_14d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_14e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xad,"void append_suite::append_null_with_string()",local_14d,&local_14e);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_170,(basic_variable<std::allocator<char>> *)local_148);
  bVar1 = std::operator==(&local_170,L"bravo");
  boost::detail::test_impl
            ("data.value<std::wstring>() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xae,"void append_suite::append_null_with_string()",bVar1);
  std::__cxx11::wstring::~wstring((wstring *)&local_170);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1a8);
  local_1aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_1a8);
  local_1ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xb2,"void append_suite::append_null_with_string()",local_1aa,&local_1ab);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_1a8,&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1e8);
  local_1ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                           ((basic_variable<std::allocator<char>_> *)local_1a8);
  local_1eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xb4,"void append_suite::append_null_with_string()",local_1ea,&local_1eb);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_210,(basic_variable<std::allocator<char>> *)local_1a8);
  bVar1 = std::operator==(&local_210,L"bravo");
  boost::detail::test_impl
            ("data.value<std::wstring>() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xb5,"void append_suite::append_null_with_string()",bVar1);
  std::__cxx11::wstring::~wstring((wstring *)&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248);
  local_24a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_248);
  local_24b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xba,"void append_suite::append_null_with_string()",local_24a,&local_24b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_248,L"charlie");
  local_24d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u16string>((basic_variable<std::allocator<char>_> *)local_248);
  local_24e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xbc,"void append_suite::append_null_with_string()",local_24d,&local_24e);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_270,(basic_variable<std::allocator<char>> *)local_248);
  bVar1 = std::operator==(&local_270,L"charlie");
  boost::detail::test_impl
            ("data.value<std::u16string>() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xbd,"void append_suite::append_null_with_string()",bVar1);
  std::__cxx11::u16string::~u16string((u16string *)&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2a8);
  local_2aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_2a8);
  local_2ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xc1,"void append_suite::append_null_with_string()",local_2aa,&local_2ab);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_2a8,&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  local_2ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u16string>((basic_variable<std::allocator<char>_> *)local_2a8);
  local_2eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xc3,"void append_suite::append_null_with_string()",local_2ea,&local_2eb);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_310,(basic_variable<std::allocator<char>> *)local_2a8);
  bVar1 = std::operator==(&local_310,L"charlie");
  boost::detail::test_impl
            ("data.value<std::u16string>() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xc4,"void append_suite::append_null_with_string()",bVar1);
  std::__cxx11::u16string::~u16string((u16string *)&local_310);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_348);
  local_34a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_348);
  local_34b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xc9,"void append_suite::append_null_with_string()",local_34a,&local_34b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_348,L"delta");
  local_34d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u32string>((basic_variable<std::allocator<char>_> *)local_348);
  local_34e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xcb,"void append_suite::append_null_with_string()",local_34d,&local_34e);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_370,(basic_variable<std::allocator<char>> *)local_348);
  bVar1 = std::operator==(&local_370,L"delta");
  boost::detail::test_impl
            ("data.value<std::u32string>() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xcc,"void append_suite::append_null_with_string()",bVar1);
  std::__cxx11::u32string::~u32string((u32string *)&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8);
  local_3aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_3a8);
  local_3ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xd0,"void append_suite::append_null_with_string()",local_3aa,&local_3ab);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3e8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_3a8,&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3e8);
  local_3ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u32string>((basic_variable<std::allocator<char>_> *)local_3a8);
  local_3eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xd2,"void append_suite::append_null_with_string()",local_3ea,&local_3eb);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_410,(basic_variable<std::allocator<char>> *)local_3a8);
  bVar1 = std::operator==(&local_410,L"delta");
  boost::detail::test_impl
            ("data.value<std::u32string>() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xd3,"void append_suite::append_null_with_string()",bVar1);
  std::__cxx11::u32string::~u32string((u32string *)&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8);
  return;
}

Assistant:

void append_null_with_string()
{
    // null - string
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += "alpha";
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<string>(), "alpha");
    }
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += variable("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<string>(), "alpha");
    }
    // null - wstring
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += L"bravo";
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST(data.value<std::wstring>() == L"bravo");
    }
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += variable(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST(data.value<std::wstring>() == L"bravo");
    }
    // null - u16string
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += u"charlie";
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST(data.value<std::u16string>() == u"charlie");
    }
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += variable(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST(data.value<std::u16string>() == u"charlie");
    }
    // null - u32string
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += U"delta";
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST(data.value<std::u32string>() == U"delta");
    }
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += variable(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST(data.value<std::u32string>() == U"delta");
    }
}